

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextProcessUndockWindow
               (ImGuiContext *ctx,ImGuiWindow *window,bool clear_persistent_docking_ref)

{
  byte *pbVar1;
  ImGuiDockNode *node;
  ImVec2 IVar2;
  ImGuiID save_dock_id;
  
  node = *(ImGuiDockNode **)((ctx->IO).KeyMap + 0xc6);
  if (node == (ImGuiDockNode *)0x0) {
    (ctx->IO).KeyMap[0xca] = 0;
  }
  else {
    save_dock_id = 0;
    if ((char)window == '\0') {
      save_dock_id = (ctx->IO).KeyMap[0xca];
    }
    DockNodeRemoveWindow(node,(ImGuiWindow *)ctx,save_dock_id);
  }
  *(undefined1 *)((long)&(ctx->IO).SetPlatformImeDataFn + 6) = 0;
  pbVar1 = (byte *)((long)(ctx->IO).KeyMap + 0x2f9);
  *pbVar1 = *pbVar1 & 0xf8;
  IVar2 = FixLargeWindowsWhenUndocking
                    ((ImVec2 *)&(ctx->IO).FontGlobalScale,
                     *(ImGuiViewport **)&(ctx->IO).MouseDoubleClickTime);
  (ctx->IO).Fonts = (ImFontAtlas *)IVar2;
  (ctx->IO).FontGlobalScale = IVar2.x;
  (ctx->IO).FontAllowUserScaling = (bool)SUB41(IVar2.y,0);
  *(int3 *)&(ctx->IO).field_0x55 = (int3)((uint)IVar2.y >> 8);
  if (GImGui->SettingsDirtyTimer <= 0.0) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  return;
}

Assistant:

void ImGui::DockContextProcessUndockWindow(ImGuiContext* ctx, ImGuiWindow* window, bool clear_persistent_docking_ref)
{
    IMGUI_DEBUG_LOG_DOCKING("DockContextProcessUndockWindow window '%s', clear_persistent_docking_ref = %d\n", window->Name, clear_persistent_docking_ref);
    IM_UNUSED(ctx);
    if (window->DockNode)
        DockNodeRemoveWindow(window->DockNode, window, clear_persistent_docking_ref ? 0 : window->DockId);
    else
        window->DockId = 0;
    window->Collapsed = false;
    window->DockIsActive = false;
    window->DockNodeIsVisible = window->DockTabIsVisible = false;
    window->Size = window->SizeFull = FixLargeWindowsWhenUndocking(window->SizeFull, window->Viewport);

    MarkIniSettingsDirty();
}